

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProcess.cpp
# Opt level: O2

void __thiscall Assimp::BaseProcess::ExecuteOnScene(BaseProcess *this,Importer *pImp)

{
  uint __line;
  ProgressHandler *pPVar1;
  char *__assertion;
  
  if ((pImp == (Importer *)0x0) || (pImp->pimpl->mScene == (aiScene *)0x0)) {
    __assertion = "__null != pImp && __null != pImp->Pimpl()->mScene";
    __line = 0x48;
  }
  else {
    pPVar1 = Importer::GetProgressHandler(pImp);
    this->progress = pPVar1;
    if (pPVar1 != (ProgressHandler *)0x0) {
      (*this->_vptr_BaseProcess[4])(this,pImp);
      (*this->_vptr_BaseProcess[5])(this,pImp->pimpl->mScene);
      return;
    }
    __assertion = "progress";
    __line = 0x4b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/BaseProcess.cpp"
                ,__line,"void Assimp::BaseProcess::ExecuteOnScene(Importer *)");
}

Assistant:

void BaseProcess::ExecuteOnScene( Importer* pImp)
{
    ai_assert(NULL != pImp && NULL != pImp->Pimpl()->mScene);

    progress = pImp->GetProgressHandler();
    ai_assert(progress);

    SetupProperties( pImp );

    // catch exceptions thrown inside the PostProcess-Step
    try
    {
        Execute(pImp->Pimpl()->mScene);

    } catch( const std::exception& err )    {

        // extract error description
        pImp->Pimpl()->mErrorString = err.what();
        ASSIMP_LOG_ERROR(pImp->Pimpl()->mErrorString);

        // and kill the partially imported data
        delete pImp->Pimpl()->mScene;
        pImp->Pimpl()->mScene = nullptr;
    }
}